

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::add_blocked_sample
          (TypedTimeSamples<std::array<float,_2UL>_> *this,double t)

{
  pointer *ppSVar1;
  iterator __position;
  Sample s;
  Sample local_20;
  
  local_20.blocked = true;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
                *)this,__position,&local_20);
  }
  else {
    *(ulong *)&(__position._M_current)->blocked = CONCAT71(local_20._17_7_,1);
    (__position._M_current)->t = t;
    *&((__position._M_current)->value)._M_elems = local_20.value._M_elems;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }